

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cose.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::cose::Sign1Message::Validate
          (Error *__return_storage_ptr__,Sign1Message *this,mbedtls_pk_context *aPublicKey)

{
  char *pcVar1;
  _Bool _Var2;
  int iVar3;
  mbedtls_pk_type_t mVar4;
  char *pcVar5;
  char *pcVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar7;
  format_args args;
  format_args args_00;
  writer write;
  string local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  writer local_90;
  mbedtls_pk_info_t *local_88;
  eckey_t_conflict *peStack_80;
  size_t local_78;
  undefined8 local_70;
  format_string_checker<char> *local_68;
  parse_func local_60 [1];
  ErrorCode local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  __return_storage_ptr__->mCode = kNone;
  local_98 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_98;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  iVar3 = mbedtls_pk_can_do(aPublicKey,MBEDTLS_PK_ECDSA);
  if (iVar3 != 0) {
    local_78 = *(size_t *)&aPublicKey->priv_id;
    local_88 = aPublicKey->pk_info;
    peStack_80 = (eckey_t_conflict *)aPublicKey->pk_ctx;
    mVar4 = mbedtls_pk_get_type((mbedtls_pk_context *)&local_88);
    if (peStack_80 != (eckey_t_conflict *)0x0 && 0xfffffffc < mVar4 - MBEDTLS_PK_RSA_ALT) {
      _Var2 = COSE_Sign0_validate_eckey(this->mSign,peStack_80,(cose_errback *)0x0);
      if (_Var2) {
        return __return_storage_ptr__;
      }
      local_88 = (mbedtls_pk_info_t *)((ulong)local_88 & 0xffffffff00000000);
      pcVar5 = "validate COSE SIGN1 message failed";
      peStack_80 = (eckey_t_conflict *)0x238868;
      local_78 = 0x22;
      local_70._0_4_ = 0;
      local_70._4_4_ = 0;
      local_60[0] = (parse_func)0x0;
      local_90.handler_ = (format_string_checker<char> *)&local_88;
      local_68 = (format_string_checker<char> *)&local_88;
      do {
        if (pcVar5 == "") break;
        pcVar6 = pcVar5;
        if (*pcVar5 == '{') {
LAB_001dc714:
          fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_90,pcVar5,pcVar6);
          pcVar5 = fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar6,"",(format_string_checker<char> *)&local_88);
          bVar7 = true;
        }
        else {
          pcVar6 = pcVar5 + 1;
          bVar7 = pcVar6 != "";
          if (bVar7) {
            if (*pcVar6 != '{') {
              pcVar1 = pcVar5 + 2;
              do {
                pcVar6 = pcVar1;
                bVar7 = pcVar6 != "";
                if (pcVar6 == "") goto LAB_001dc710;
                pcVar1 = pcVar6 + 1;
              } while (*pcVar6 != '{');
            }
            bVar7 = true;
          }
LAB_001dc710:
          if (bVar7) goto LAB_001dc714;
          fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_90,pcVar5,"");
          bVar7 = false;
        }
      } while (bVar7);
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)&local_88;
      fmt::v10::vformat_abi_cxx11_
                (&local_b8,(v10 *)"validate COSE SIGN1 message failed",(string_view)ZEXT816(0x22),
                 args_00);
      local_58 = kSecurity;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,local_b8._M_dataplus._M_p,
                 local_b8._M_dataplus._M_p + local_b8._M_string_length);
      goto LAB_001dc63a;
    }
  }
  local_88 = (mbedtls_pk_info_t *)((ulong)local_88 & 0xffffffff00000000);
  pcVar5 = "validate COSE SIGN1 message without valid EC public key";
  peStack_80 = (eckey_t_conflict *)0x23888b;
  local_78 = 0x37;
  local_70._0_4_ = 0;
  local_70._4_4_ = 0;
  local_60[0] = (parse_func)0x0;
  local_90.handler_ = (format_string_checker<char> *)&local_88;
  local_68 = (format_string_checker<char> *)&local_88;
  do {
    if (pcVar5 == "") break;
    pcVar6 = pcVar5;
    if (*pcVar5 == '{') {
LAB_001dc5b4:
      fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&local_90,pcVar5,pcVar6);
      pcVar5 = fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar6,"",(format_string_checker<char> *)&local_88);
      bVar7 = true;
    }
    else {
      pcVar6 = pcVar5 + 1;
      bVar7 = pcVar6 != "";
      if (bVar7) {
        if (*pcVar6 != '{') {
          pcVar1 = pcVar5 + 2;
          do {
            pcVar6 = pcVar1;
            bVar7 = pcVar6 != "";
            if (pcVar6 == "") goto LAB_001dc5b0;
            pcVar1 = pcVar6 + 1;
          } while (*pcVar6 != '{');
        }
        bVar7 = true;
      }
LAB_001dc5b0:
      if (bVar7) goto LAB_001dc5b4;
      fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&local_90,pcVar5,"");
      bVar7 = false;
    }
  } while (bVar7);
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_88;
  fmt::v10::vformat_abi_cxx11_
            (&local_b8,(v10 *)"validate COSE SIGN1 message without valid EC public key",
             (string_view)ZEXT816(0x37),args);
  local_58 = kInvalidArgs;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,local_b8._M_dataplus._M_p,
             local_b8._M_dataplus._M_p + local_b8._M_string_length);
LAB_001dc63a:
  __return_storage_ptr__->mCode = local_58;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Sign1Message::Validate(const mbedtls_pk_context &aPublicKey)
{
    Error                             error;
    const struct mbedtls_ecp_keypair *eckey;

    // Accepts only EC keys
    VerifyOrExit(mbedtls_pk_can_do(&aPublicKey, MBEDTLS_PK_ECDSA) && (eckey = mbedtls_pk_ec(aPublicKey)) != nullptr,
                 error = ERROR_INVALID_ARGS("validate COSE SIGN1 message without valid EC public key"));

    VerifyOrExit(COSE_Sign0_validate_eckey(mSign, eckey, nullptr),
                 error = ERROR_SECURITY("validate COSE SIGN1 message failed"));

exit:
    return error;
}